

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_control-test.cpp
# Opt level: O1

void print_button(char *name,bool state)

{
  size_t sVar1;
  char *pcVar2;
  
  if (name == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x11c208);
  }
  else {
    sVar1 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,name,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  pcVar2 = "released";
  if (state) {
    pcVar2 = "pressed";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,8 - (ulong)state);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  return;
}

Assistant:

void print_button(const char *name, bool state)
{
  cout << name << " " << (state ? "pressed" : "released") << endl;
}